

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall cmCTest::Initialize(cmCTest *this,char *binary_dir,cmCTestStartCommand *command)

{
  char *pcVar1;
  char *pcVar2;
  pointer pcVar3;
  size_type sVar4;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  cmMakefile *this_00;
  tm *ptVar8;
  bool suppress;
  char cVar9;
  cmCTest *this_01;
  ios_base *this_02;
  int iVar10;
  bool bVar11;
  string testingDir;
  string tag;
  string tagfile;
  int day;
  time_t tctime;
  auto_ptr<cmMakefile> mf;
  int min;
  int hour;
  int year;
  string tagmode;
  int mon;
  cmake cm;
  ifstream tfin;
  cmGlobalGenerator gg;
  undefined8 in_stack_fffffffffffff068;
  undefined4 uVar12;
  string local_f80;
  string local_f60;
  long *local_f40 [2];
  long local_f30 [2];
  cmCTestStartCommand *local_f20;
  string local_f18;
  time_t local_ef8;
  auto_ptr<cmMakefile> local_ef0;
  undefined4 local_ee8;
  undefined4 local_ee4;
  string local_ee0;
  undefined1 local_ec0 [112];
  ios_base local_e50 [264];
  undefined1 local_d48 [8];
  ulong local_d40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d38;
  byte abStack_d28 [80];
  ios_base local_cd8 [136];
  ios_base local_c50 [264];
  string local_b48;
  string local_b28 [3];
  undefined1 local_ac0 [632];
  cmState *local_848;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_840;
  size_type local_838;
  undefined1 local_808 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7f8;
  byte abStack_7e8 [80];
  ios_base local_798 [416];
  undefined1 local_5f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e8 [6];
  ios_base local_588 [1368];
  
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffff068 >> 0x20);
  if (command == (cmCTestStartCommand *)0x0) {
    suppress = false;
  }
  else {
    suppress = command->Quiet;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5f8,"Here: ",6);
  plVar6 = (long *)std::ostream::operator<<(local_5f8,0x181);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x181,(char *)local_ac0._0_8_,suppress);
  pcVar1 = local_ac0 + 0x10;
  if ((char *)local_ac0._0_8_ != pcVar1) {
    operator_delete((void *)local_ac0._0_8_,local_ac0._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
  this_01 = (cmCTest *)local_588;
  std::ios_base::~ios_base((ios_base *)this_01);
  local_f20 = command;
  if (this->InteractiveDebugMode == false) {
    BlockTestErrorDiagnostics(this_01);
  }
  else {
    local_5f8._0_8_ = local_5e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_5f8,"CTEST_INTERACTIVE_DEBUG_MODE=1","");
    cmsys::SystemTools::PutEnv((string *)local_5f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._0_8_ != local_5e8) {
      operator_delete((void *)local_5f8._0_8_,local_5e8[0]._M_allocated_capacity + 1);
    }
  }
  pcVar2 = (char *)(this->BinaryDir)._M_string_length;
  strlen(binary_dir);
  std::__cxx11::string::_M_replace((ulong)&this->BinaryDir,0,pcVar2,(ulong)binary_dir);
  cmsys::SystemTools::ConvertToUnixSlashes(&this->BinaryDir);
  UpdateCTestConfiguration(this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5f8,"Here: ",6);
  plVar6 = (long *)std::ostream::operator<<(local_5f8,0x18d);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x18d,(char *)local_ac0._0_8_,suppress);
  if ((char *)local_ac0._0_8_ != pcVar1) {
    operator_delete((void *)local_ac0._0_8_,local_ac0._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
  std::ios_base::~ios_base(local_588);
  if (this->ProduceXML == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5f8,"Here: ",6);
    plVar6 = (long *)std::ostream::operator<<(local_5f8,399);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        399,(char *)local_ac0._0_8_,suppress);
    if ((char *)local_ac0._0_8_ != pcVar1) {
      operator_delete((void *)local_ac0._0_8_,local_ac0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
    std::ios_base::~ios_base(local_588);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5f8,"   Site: ",9);
    local_808._0_8_ = &local_7f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_808,"Site","");
    GetCTestConfiguration((string *)local_ac0,this,(string *)local_808);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5f8,(char *)local_ac0._0_8_,local_ac0._8_8_);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"   Build name: ",0xf);
    local_b28[0]._M_dataplus._M_p = (pointer)&local_b28[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b28,"BuildName","");
    GetCTestConfiguration((string *)local_ec0,this,local_b28);
    SafeBuildIdField((string *)local_d48,(string *)local_ec0);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_d48,local_d40);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if (local_d48 != (undefined1  [8])&local_d38) {
      operator_delete((void *)local_d48,
                      CONCAT71(local_d38._M_allocated_capacity._1_7_,local_d38._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_ec0._0_8_ != local_ec0 + 0x10) {
      operator_delete((void *)local_ec0._0_8_,local_ec0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b28[0]._M_dataplus._M_p != &local_b28[0].field_2) {
      operator_delete(local_b28[0]._M_dataplus._M_p,local_b28[0].field_2._M_allocated_capacity + 1);
    }
    if ((char *)local_ac0._0_8_ != pcVar1) {
      operator_delete((void *)local_ac0._0_8_,local_ac0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_808._0_8_ != &local_7f8) {
      operator_delete((void *)local_808._0_8_,local_7f8._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    Log(this,1,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x196,(char *)local_ac0._0_8_,suppress);
    if ((char *)local_ac0._0_8_ != pcVar1) {
      operator_delete((void *)local_ac0._0_8_,local_ac0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
    std::ios_base::~ios_base(local_588);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5f8,"Produce XML is on",0x11);
    std::ios::widen((char)(ostringstream *)local_5f8 +
                    (char)*(undefined8 *)(local_5f8._0_8_ + -0x18));
    std::ostream::put((char)local_5f8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x197,(char *)local_ac0._0_8_,suppress);
    if ((char *)local_ac0._0_8_ != pcVar1) {
      operator_delete((void *)local_ac0._0_8_,local_ac0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
    std::ios_base::~ios_base(local_588);
    if (this->TestModel == 1) {
      local_ee0._M_dataplus._M_p = (pointer)&local_ee0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ee0,"NightlyStartTime","");
      GetCTestConfiguration(&local_b48,this,&local_ee0);
      bVar11 = local_b48._M_string_length == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b48._M_dataplus._M_p != &local_b48.field_2) {
        operator_delete(local_b48._M_dataplus._M_p,local_b48.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ee0._M_dataplus._M_p != &local_ee0.field_2) {
        operator_delete(local_ee0._M_dataplus._M_p,local_ee0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5f8,
                 "WARNING: No nightly start time found please set in CTestConfig.cmake or DartConfig.cmake"
                 ,0x58);
      std::ios::widen((char)(ostringstream *)local_5f8 +
                      (char)*(undefined8 *)(local_5f8._0_8_ + -0x18));
      std::ostream::put((char)local_5f8);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,5,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x19f,(char *)local_ac0._0_8_,suppress);
      if ((char *)local_ac0._0_8_ != pcVar1) {
        operator_delete((void *)local_ac0._0_8_,local_ac0._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
      std::ios_base::~ios_base(local_588);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5f8,"Here: ",6);
      plVar6 = (long *)std::ostream::operator<<(local_5f8,0x1a0);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,0,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x1a1,(char *)local_ac0._0_8_,suppress);
      if ((char *)local_ac0._0_8_ != pcVar1) {
        operator_delete((void *)local_ac0._0_8_,local_ac0._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5f8);
      std::ios_base::~ios_base(local_588);
      return 0;
    }
  }
  cmake::cmake((cmake *)local_ac0,RoleScript);
  local_5f8._0_8_ = local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"");
  cmake::SetHomeDirectory((cmake *)local_ac0,(string *)local_5f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._0_8_ != local_5e8) {
    operator_delete((void *)local_5f8._0_8_,local_5e8[0]._M_allocated_capacity + 1);
  }
  local_5f8._0_8_ = local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"");
  cmake::SetHomeOutputDirectory((cmake *)local_ac0,(string *)local_5f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._0_8_ != local_5e8) {
    operator_delete((void *)local_5f8._0_8_,local_5e8[0]._M_allocated_capacity + 1);
  }
  local_5e8[0]._M_allocated_capacity = local_838;
  local_5f8._0_8_ = local_848;
  local_5f8._8_8_ = pcStack_840;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_5f8);
  cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)local_5f8,(cmake *)local_ac0);
  this_00 = (cmMakefile *)operator_new(0x760);
  local_7f8._M_allocated_capacity = local_838;
  local_808._0_8_ = local_848;
  local_808._8_8_ = pcStack_840;
  cmMakefile::cmMakefile(this_00,(cmGlobalGenerator *)local_5f8,(cmStateSnapshot *)local_808);
  local_ef0.x_ = this_00;
  ReadCustomConfigurationFileTree(this,(this->BinaryDir)._M_dataplus._M_p,this_00);
  iVar10 = 1;
  if (this->ProduceXML != true) goto LAB_0028604c;
  pcVar3 = (this->BinaryDir)._M_dataplus._M_p;
  local_f80._M_dataplus._M_p = (pointer)&local_f80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f80,pcVar3,pcVar3 + (this->BinaryDir)._M_string_length);
  std::__cxx11::string::append((char *)&local_f80);
  bVar11 = cmsys::SystemTools::FileExists(local_f80._M_dataplus._M_p);
  if (bVar11) {
    bVar11 = cmsys::SystemTools::FileIsDirectory(&local_f80);
    if (!bVar11) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_808);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_808,"File ",5);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_808,local_f80._M_dataplus._M_p,local_f80._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," is in the place of the testing directory",0x29);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,6,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x1bd,(char *)local_d48,false);
      goto LAB_00285668;
    }
LAB_002855b1:
    if (local_f20 == (cmCTestStartCommand *)0x0) {
      cVar9 = '\x01';
    }
    else {
      cVar9 = local_f20->CreateNewTag;
    }
    local_f40[0] = local_f30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_f40,local_f80._M_dataplus._M_p,
               local_f80._M_dataplus._M_p + local_f80._M_string_length);
    std::__cxx11::string::append((char *)local_f40);
    std::ifstream::ifstream(local_808,(char *)local_f40[0],_S_in);
    local_f60._M_dataplus._M_p = (pointer)&local_f60.field_2;
    local_f60._M_string_length = 0;
    local_f60.field_2._M_local_buf[0] = '\0';
    if (cVar9 != '\0') {
      local_ef8 = time((time_t *)0x0);
      if (this->TomorrowTag == true) {
        local_ef8 = local_ef8 + 0x15180;
      }
      ptVar8 = gmtime(&local_ef8);
      if (((abStack_7e8[*(long *)(local_808._0_8_ + -0x18)] & 5) == 0) &&
         (bVar11 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)local_808,&local_f60,(bool *)0x0,-1), bVar11)) {
        local_ec0._0_8_ = local_ec0._0_8_ & 0xffffffff00000000;
        local_b28[0]._M_dataplus._M_p = local_b28[0]._M_dataplus._M_p & 0xffffffff00000000;
        local_f18._M_dataplus._M_p._0_4_ = 0;
        local_ee4 = 0;
        uVar12 = (undefined4)((ulong)&local_ee8 >> 0x20);
        local_ee8 = 0;
        __isoc99_sscanf(local_f60._M_dataplus._M_p,"%04d%02d%02d-%02d%02d",local_ec0);
        if ((local_ec0._0_4_ != ptVar8->tm_year + 0x76c) ||
           (((int)local_b28[0]._M_dataplus._M_p != ptVar8->tm_mon + 1 ||
            ((int)local_f18._M_dataplus._M_p != ptVar8->tm_mday)))) {
          std::__cxx11::string::_M_replace
                    ((ulong)&local_f60,0,(char *)local_f60._M_string_length,0x674b0e);
        }
        local_d40 = 0;
        local_d38._M_local_buf[0] = '\0';
        local_d48 = (undefined1  [8])&local_d38;
        bVar11 = cmsys::SystemTools::GetLineFromStream
                           ((istream *)local_808,(string *)local_d48,(bool *)0x0,-1);
        if ((bVar11 && 4 < local_d40) && (this->Parts[0].Enabled == false)) {
          iVar5 = GetTestModelFromString((char *)local_d48);
          this->TestModel = iVar5;
        }
        std::ifstream::close();
        if (local_d48 != (undefined1  [8])&local_d38) {
          operator_delete((void *)local_d48,
                          CONCAT71(local_d38._M_allocated_capacity._1_7_,local_d38._M_local_buf[0])
                          + 1);
        }
      }
      if (((local_f20 != (cmCTestStartCommand *)0x0) ||
          ((char *)local_f60._M_string_length == (char *)0x0)) || (this->Parts[0].Enabled == true))
      {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d48);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d48,"TestModel: ",0xb);
        GetTestModelString_abi_cxx11_((string *)local_ec0,this);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_d48,(char *)local_ec0._0_8_,local_ec0._8_8_);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        pcVar1 = local_ec0 + 0x10;
        if ((char *)local_ec0._0_8_ != pcVar1) {
          operator_delete((void *)local_ec0._0_8_,local_ec0._16_8_ + 1);
        }
        std::__cxx11::stringbuf::str();
        Log(this,0,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x1f0,(char *)local_ec0._0_8_,suppress);
        if ((char *)local_ec0._0_8_ != pcVar1) {
          operator_delete((void *)local_ec0._0_8_,local_ec0._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d48);
        std::ios_base::~ios_base(local_cd8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d48);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d48,"TestModel: ",0xb);
        plVar6 = (long *)std::ostream::operator<<(local_d48,this->TestModel);
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,0,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x1f2,(char *)local_ec0._0_8_,suppress);
        if ((char *)local_ec0._0_8_ != pcVar1) {
          operator_delete((void *)local_ec0._0_8_,local_ec0._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d48);
        std::ios_base::~ios_base(local_cd8);
        if (this->TestModel == 1) {
          local_ec0._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_ec0,"NightlyStartTime","")
          ;
          GetCTestConfiguration((string *)local_d48,this,(string *)local_ec0);
          ptVar8 = (tm *)GetNightlyTime(this,(string *)local_d48,this->TomorrowTag);
          if (local_d48 != (undefined1  [8])&local_d38) {
            operator_delete((void *)local_d48,
                            CONCAT71(local_d38._M_allocated_capacity._1_7_,local_d38._M_local_buf[0]
                                    ) + 1);
          }
          if ((char *)local_ec0._0_8_ != pcVar1) {
            operator_delete((void *)local_ec0._0_8_,local_ec0._16_8_ + 1);
          }
        }
        sprintf((char *)local_b28,"%04d%02d%02d-%02d%02d",(ulong)(ptVar8->tm_year + 0x76c),
                (ulong)(ptVar8->tm_mon + 1),(ulong)(uint)ptVar8->tm_mday,
                (ulong)(uint)ptVar8->tm_hour,CONCAT44(uVar12,ptVar8->tm_min));
        sVar4 = local_f60._M_string_length;
        strlen((char *)local_b28);
        std::__cxx11::string::_M_replace((ulong)&local_f60,0,(char *)sVar4,(ulong)local_b28);
        std::ofstream::ofstream(local_d48,(char *)local_f40[0],_S_out);
        if ((abStack_d28[*(long *)((long)local_d48 + -0x18)] & 5) == 0) {
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_d48,local_f60._M_dataplus._M_p,
                              local_f60._M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          GetTestModelString_abi_cxx11_((string *)local_ec0,this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_d48,(char *)local_ec0._0_8_,local_ec0._8_8_);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if ((char *)local_ec0._0_8_ != pcVar1) {
            operator_delete((void *)local_ec0._0_8_,local_ec0._16_8_ + 1);
          }
        }
        std::ofstream::close();
        if (local_f20 == (cmCTestStartCommand *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ec0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_ec0,"Create new tag: ",0x10);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_ec0,local_f60._M_dataplus._M_p,
                              local_f60._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," - ",3);
          GetTestModelString_abi_cxx11_(&local_f18,this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)CONCAT44(local_f18._M_dataplus._M_p._4_4_,
                                                      (int)local_f18._M_dataplus._M_p),
                              local_f18._M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_f18._M_dataplus._M_p._4_4_,(int)local_f18._M_dataplus._M_p) !=
              &local_f18.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_f18._M_dataplus._M_p._4_4_,
                                     (int)local_f18._M_dataplus._M_p),
                            local_f18.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          Log(this,1,
              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
              ,0x207,(char *)CONCAT44(local_f18._M_dataplus._M_p._4_4_,
                                      (int)local_f18._M_dataplus._M_p),suppress);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_f18._M_dataplus._M_p._4_4_,(int)local_f18._M_dataplus._M_p) !=
              &local_f18.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_f18._M_dataplus._M_p._4_4_,
                                     (int)local_f18._M_dataplus._M_p),
                            local_f18.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ec0);
          std::ios_base::~ios_base(local_e50);
        }
        local_d48 = (undefined1  [8])_VTT;
        *(undefined8 *)(local_d48 + *(long *)(_VTT->_M_local_buf + -0x18)) = _vtable;
        std::filebuf::~filebuf((filebuf *)&local_d40);
        this_02 = local_c50;
        goto LAB_00285fd7;
      }
LAB_00285fdc:
      std::__cxx11::string::_M_assign((string *)&this->CurrentTag);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f60._M_dataplus._M_p != &local_f60.field_2) {
        operator_delete(local_f60._M_dataplus._M_p,
                        CONCAT71(local_f60.field_2._M_allocated_capacity._1_7_,
                                 local_f60.field_2._M_local_buf[0]) + 1);
      }
      std::ifstream::~ifstream(local_808);
      if (local_f40[0] != local_f30) {
        operator_delete(local_f40[0],local_f30[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f80._M_dataplus._M_p != &local_f80.field_2) {
        operator_delete(local_f80._M_dataplus._M_p,local_f80.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0028604c;
    }
    if ((abStack_7e8[*(long *)(local_808._0_8_ + -0x18)] & 5) == 0) {
      cmsys::SystemTools::GetLineFromStream((istream *)local_808,&local_f60,(bool *)0x0,-1);
      std::ifstream::close();
    }
    if ((char *)local_f60._M_string_length != (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d48);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_d48,"  Use existing tag: ",0x14);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_d48,local_f60._M_dataplus._M_p,local_f60._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," - ",3);
      GetTestModelString_abi_cxx11_((string *)local_ec0,this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)local_ec0._0_8_,local_ec0._8_8_);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((undefined1 *)local_ec0._0_8_ != local_ec0 + 0x10) {
        operator_delete((void *)local_ec0._0_8_,local_ec0._16_8_ + 1);
      }
      std::__cxx11::stringbuf::str();
      Log(this,1,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x219,(char *)local_ec0._0_8_,suppress);
      if ((undefined1 *)local_ec0._0_8_ != local_ec0 + 0x10) {
        operator_delete((void *)local_ec0._0_8_,local_ec0._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d48);
      this_02 = local_cd8;
LAB_00285fd7:
      std::ios_base::~ios_base(this_02);
      goto LAB_00285fdc;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d48,"Cannot read existing TAG file in ",0x21);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_d48,local_f80._M_dataplus._M_p,local_f80._M_string_length);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,6,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x212,(char *)local_ec0._0_8_,false);
    if ((undefined1 *)local_ec0._0_8_ != local_ec0 + 0x10) {
      operator_delete((void *)local_ec0._0_8_,local_ec0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d48);
    std::ios_base::~ios_base(local_cd8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f60._M_dataplus._M_p != &local_f60.field_2) {
      operator_delete(local_f60._M_dataplus._M_p,
                      CONCAT71(local_f60.field_2._M_allocated_capacity._1_7_,
                               local_f60.field_2._M_local_buf[0]) + 1);
    }
    std::ifstream::~ifstream(local_808);
    if (local_f40[0] != local_f30) {
      operator_delete(local_f40[0],local_f30[0] + 1);
    }
  }
  else {
    bVar11 = cmsys::SystemTools::MakeDirectory(local_f80._M_dataplus._M_p);
    if (bVar11) goto LAB_002855b1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_808);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_808,"Cannot create directory ",0x18);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_808,local_f80._M_dataplus._M_p,local_f80._M_string_length);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,6,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x1c3,(char *)local_d48,false);
LAB_00285668:
    if (local_d48 != (undefined1  [8])&local_d38) {
      operator_delete((void *)local_d48,
                      CONCAT71(local_d38._M_allocated_capacity._1_7_,local_d38._M_local_buf[0]) + 1)
      ;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_808);
    std::ios_base::~ios_base(local_798);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f80._M_dataplus._M_p != &local_f80.field_2) {
    operator_delete(local_f80._M_dataplus._M_p,local_f80.field_2._M_allocated_capacity + 1);
  }
  iVar10 = 0;
LAB_0028604c:
  ::cm::auto_ptr<cmMakefile>::~auto_ptr(&local_ef0);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)local_5f8);
  cmake::~cmake((cmake *)local_ac0);
  return iVar10;
}

Assistant:

int cmCTest::Initialize(const char* binary_dir, cmCTestStartCommand* command)
{
  bool quiet = false;
  if (command && command->ShouldBeQuiet()) {
    quiet = true;
  }

  cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
  if (!this->InteractiveDebugMode) {
    this->BlockTestErrorDiagnostics();
  } else {
    cmSystemTools::PutEnv("CTEST_INTERACTIVE_DEBUG_MODE=1");
  }

  this->BinaryDir = binary_dir;
  cmSystemTools::ConvertToUnixSlashes(this->BinaryDir);

  this->UpdateCTestConfiguration();

  cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
  if (this->ProduceXML) {
    cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
    cmCTestOptionalLog(
      this, OUTPUT, "   Site: "
        << this->GetCTestConfiguration("Site") << std::endl
        << "   Build name: "
        << cmCTest::SafeBuildIdField(this->GetCTestConfiguration("BuildName"))
        << std::endl,
      quiet);
    cmCTestOptionalLog(this, DEBUG, "Produce XML is on" << std::endl, quiet);
    if (this->TestModel == cmCTest::NIGHTLY &&
        this->GetCTestConfiguration("NightlyStartTime").empty()) {
      cmCTestOptionalLog(
        this, WARNING,
        "WARNING: No nightly start time found please set in CTestConfig.cmake"
        " or DartConfig.cmake"
          << std::endl,
        quiet);
      cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl,
                         quiet);
      return 0;
    }
  }

  cmake cm(cmake::RoleScript);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  CM_AUTO_PTR<cmMakefile> mf(new cmMakefile(&gg, cm.GetCurrentSnapshot()));
  if (!this->ReadCustomConfigurationFileTree(this->BinaryDir.c_str(),
                                             mf.get())) {
    cmCTestOptionalLog(
      this, DEBUG, "Cannot find custom configuration file tree" << std::endl,
      quiet);
    return 0;
  }

  if (this->ProduceXML) {
    // Verify "Testing" directory exists:
    //
    std::string testingDir = this->BinaryDir + "/Testing";
    if (cmSystemTools::FileExists(testingDir.c_str())) {
      if (!cmSystemTools::FileIsDirectory(testingDir)) {
        cmCTestLog(this, ERROR_MESSAGE, "File "
                     << testingDir
                     << " is in the place of the testing directory"
                     << std::endl);
        return 0;
      }
    } else {
      if (!cmSystemTools::MakeDirectory(testingDir.c_str())) {
        cmCTestLog(this, ERROR_MESSAGE, "Cannot create directory "
                     << testingDir << std::endl);
        return 0;
      }
    }

    // Create new "TAG" file or read existing one:
    //
    bool createNewTag = true;
    if (command) {
      createNewTag = command->ShouldCreateNewTag();
    }

    std::string tagfile = testingDir + "/TAG";
    cmsys::ifstream tfin(tagfile.c_str());
    std::string tag;

    if (createNewTag) {
      time_t tctime = time(CM_NULLPTR);
      if (this->TomorrowTag) {
        tctime += (24 * 60 * 60);
      }
      struct tm* lctime = gmtime(&tctime);
      if (tfin && cmSystemTools::GetLineFromStream(tfin, tag)) {
        int year = 0;
        int mon = 0;
        int day = 0;
        int hour = 0;
        int min = 0;
        sscanf(tag.c_str(), "%04d%02d%02d-%02d%02d", &year, &mon, &day, &hour,
               &min);
        if (year != lctime->tm_year + 1900 || mon != lctime->tm_mon + 1 ||
            day != lctime->tm_mday) {
          tag = "";
        }
        std::string tagmode;
        if (cmSystemTools::GetLineFromStream(tfin, tagmode)) {
          if (tagmode.size() > 4 && !this->Parts[PartStart]) {
            this->TestModel = cmCTest::GetTestModelFromString(tagmode.c_str());
          }
        }
        tfin.close();
      }
      if (tag.empty() || (CM_NULLPTR != command) || this->Parts[PartStart]) {
        cmCTestOptionalLog(
          this, DEBUG,
          "TestModel: " << this->GetTestModelString() << std::endl, quiet);
        cmCTestOptionalLog(
          this, DEBUG, "TestModel: " << this->TestModel << std::endl, quiet);
        if (this->TestModel == cmCTest::NIGHTLY) {
          lctime = this->GetNightlyTime(
            this->GetCTestConfiguration("NightlyStartTime"),
            this->TomorrowTag);
        }
        char datestring[100];
        sprintf(datestring, "%04d%02d%02d-%02d%02d", lctime->tm_year + 1900,
                lctime->tm_mon + 1, lctime->tm_mday, lctime->tm_hour,
                lctime->tm_min);
        tag = datestring;
        cmsys::ofstream ofs(tagfile.c_str());
        if (ofs) {
          ofs << tag << std::endl;
          ofs << this->GetTestModelString() << std::endl;
        }
        ofs.close();
        if (CM_NULLPTR == command) {
          cmCTestOptionalLog(this, OUTPUT, "Create new tag: "
                               << tag << " - " << this->GetTestModelString()
                               << std::endl,
                             quiet);
        }
      }
    } else {
      if (tfin) {
        cmSystemTools::GetLineFromStream(tfin, tag);
        tfin.close();
      }

      if (tag.empty()) {
        cmCTestLog(this, ERROR_MESSAGE, "Cannot read existing TAG file in "
                     << testingDir << std::endl);
        return 0;
      }

      cmCTestOptionalLog(this, OUTPUT, "  Use existing tag: "
                           << tag << " - " << this->GetTestModelString()
                           << std::endl,
                         quiet);
    }

    this->CurrentTag = tag;
  }

  return 1;
}